

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O3

bool __thiscall
QtPrivate::QStringList_contains
          (QtPrivate *this,QStringList *that,QLatin1StringView str,CaseSensitivity cs)

{
  int iVar1;
  QString *string;
  QString *this_00;
  long lVar2;
  QLatin1StringView other;
  
  other.m_data = (char *)str.m_size;
  if (*(long *)(this + 0x10) == 0) {
    return false;
  }
  this_00 = *(QString **)(this + 8);
  lVar2 = *(long *)(this + 0x10) * 0x18;
  while (((QStringList *)(this_00->d).size != that ||
         (other.m_size = (qsizetype)that,
         iVar1 = QString::compare(this_00,other,(CaseSensitivity)str.m_data), iVar1 != 0))) {
    this_00 = this_00 + 1;
    lVar2 = lVar2 + -0x18;
    if (lVar2 == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool QtPrivate::QStringList_contains(const QStringList *that, QLatin1StringView str,
                                     Qt::CaseSensitivity cs)
{
    return stringList_contains(*that, str, cs);
}